

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmselect.c
# Opt level: O0

void libcmselect_LTX_polling_function(CMtrans_services svc,void *client_data)

{
  int iVar1;
  long *in_RSI;
  long in_RDI;
  select_data_ptr sd;
  select_data_ptr *in_stack_00000018;
  CMtrans_services in_stack_00000020;
  int in_stack_00000240;
  int in_stack_00000244;
  select_data_ptr in_stack_00000248;
  CMtrans_services in_stack_00000250;
  long local_18;
  
  local_18 = *in_RSI;
  if (local_18 == 0) {
    init_select_data(in_stack_00000020,in_stack_00000018,(CManager_conflict)svc);
    local_18 = *in_RSI;
  }
  if ((*(long *)(local_18 + 0x40) != 0) &&
     (iVar1 = (**(code **)(in_RDI + 0xb8))
                        (*(undefined8 *)(local_18 + 0x40),
                         "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmselect.c"
                         ,0x413), iVar1 == 0)) {
    printf("%s:%u: failed assertion `%s\'\n",
           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmselect.c"
           ,0x413,"CM_LOCKED(svc, sd->cm)");
    abort();
  }
  socket_select(in_stack_00000250,in_stack_00000248,in_stack_00000244,in_stack_00000240);
  return;
}

Assistant:

extern void
libcmselect_LTX_polling_function(CMtrans_services svc, void *client_data)
{
    select_data_ptr sd = *((select_data_ptr *)client_data);
    if (sd == NULL) {
	init_select_data(svc, (select_data_ptr*)client_data, (CManager)NULL);
	sd = *((select_data_ptr *)client_data);
    }
    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    socket_select(svc, sd, 0, 0); /* no blocking, immediate timeout */
}